

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backend_sdl.cpp
# Opt level: O0

bool __thiscall
CGraphicsBackend_SDL_OpenGL::GetDesktopResolution
          (CGraphicsBackend_SDL_OpenGL *this,int Index,int *pDesktopWidth,int *pDesktopHeight)

{
  int iVar1;
  undefined4 *in_RCX;
  undefined4 *in_RDX;
  undefined4 in_ESI;
  long in_FS_OFFSET;
  SDL_DisplayMode DisplayMode;
  undefined1 local_20 [4];
  undefined4 local_1c;
  undefined4 local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = SDL_GetDesktopDisplayMode(in_ESI,local_20);
  if (iVar1 == 0) {
    *in_RDX = local_1c;
    *in_RCX = local_18;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return iVar1 == 0;
}

Assistant:

bool CGraphicsBackend_SDL_OpenGL::GetDesktopResolution(int Index, int *pDesktopWidth, int* pDesktopHeight)
{
	SDL_DisplayMode DisplayMode;
	if(SDL_GetDesktopDisplayMode(Index, &DisplayMode))
		return false;

	*pDesktopWidth = DisplayMode.w;
	*pDesktopHeight = DisplayMode.h;
	return true;
}